

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

Nonnull<char_*> absl::numbers_internal::FastIntToBuffer(uint32_t n,Nonnull<char_*> out_str)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Nonnull<char_*> pcVar4;
  ulong uVar5;
  long lVar6;
  
  if (n < 10) {
    *out_str = (byte)n | 0x30;
    pcVar4 = out_str + 1;
  }
  else if (n < 100000000) {
    uVar5 = (ulong)(n % 10000) << 0x20 | (ulong)n / 10000;
    lVar6 = (uVar5 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar5 * 0x10000;
    uVar5 = ((ulong)(lVar6 * 0x67) >> 10 & 0xf000f000f000f) * -0x9ff + lVar6 * 0x100;
    if (uVar5 == 0) {
      __assert_fail("bottom != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0xf4,
                    "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                   );
    }
    uVar1 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    *(ulong *)out_str = uVar5 + 0x3030303030303030 >> ((byte)uVar1 & 0x38);
    pcVar4 = out_str + (8 - (uVar1 >> 3 & 0x1fffffff));
  }
  else {
    uVar5 = (ulong)((n % 100000000) % 10000) << 0x20 | (ulong)(n % 100000000) / 10000;
    lVar6 = (uVar5 * 0x28f6 >> 0x14 & 0x7f0000007f) * -0x63ffff + uVar5 * 0x10000;
    uVar5 = (ulong)(lVar6 * 0x67) >> 10 & 0xf000f000f000f;
    iVar2 = n / 100000000 - 10;
    iVar3 = iVar2 >> 8;
    *(short *)out_str =
         (short)((n / 100000000) * 0x100 + (n / 1000000000) * -0x9ff + 0x3030 >>
                ((byte)((uint)iVar2 >> 8) & 8));
    pcVar4 = out_str + (long)iVar3 + 10;
    *(ulong *)(out_str + (long)iVar3 + 2) =
         (uVar5 | 0x3030303030303030) + (uVar5 * 0xfffffffffffff6 + lVar6) * 0x100;
  }
  *pcVar4 = '\0';
  return pcVar4;
}

Assistant:

inline ABSL_ATTRIBUTE_ALWAYS_INLINE absl::Nonnull<char*> EncodeFullU32(
    uint32_t n, absl::Nonnull<char*> out_str) {
  if (n < 10) {
    *out_str = static_cast<char>('0' + n);
    return out_str + 1;
  }
  if (n < 100'000'000) {
    uint64_t bottom = PrepareEightDigits(n);
    ABSL_ASSUME(bottom != 0);
    // 0 minus 8 to make MSVC happy.
    uint32_t zeroes =
        static_cast<uint32_t>(absl::countr_zero(bottom)) & (0 - 8u);
    little_endian::Store64(out_str, (bottom + kEightZeroBytes) >> zeroes);
    return out_str + sizeof(bottom) - zeroes / 8;
  }
  uint32_t div08 = n / 100'000'000;
  uint32_t mod08 = n % 100'000'000;
  uint64_t bottom = PrepareEightDigits(mod08) + kEightZeroBytes;
  out_str = EncodeHundred(div08, out_str);
  little_endian::Store64(out_str, bottom);
  return out_str + sizeof(bottom);
}